

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

CKey __thiscall ADPlanner::ComputeKey(ADPlanner *this,ADState *state)

{
  int *piVar1;
  uint uVar2;
  ulong in_RDX;
  long in_RSI;
  CKey *in_RDI;
  CKey CVar3;
  CKey *key;
  
  CKey::CKey(in_RDI);
  if (*(uint *)(in_RDX + 0x20) < *(uint *)(in_RDX + 0x24)) {
    in_RDI->key[0] = (ulong)(uint)(*(int *)(in_RDX + 0x20) + *(int *)(in_RDX + 0x44));
    in_RDI->key[1] = 0;
  }
  else {
    piVar1 = (int *)(in_RDX + 0x24);
    uVar2 = (uint)(**(double **)(in_RSI + 0x78) * (double)*(int *)(in_RDX + 0x44));
    in_RDX = (ulong)uVar2;
    in_RDI->key[0] = (ulong)(*piVar1 + uVar2);
    in_RDI->key[1] = 1;
  }
  CVar3.key[1] = in_RDX;
  CVar3.key[0] = (long)in_RDI;
  return (CKey)CVar3.key;
}

Assistant:

CKey ADPlanner::ComputeKey(ADState* state)
{
    CKey key;

    if (state->v >= state->g) {
        key.key[0] = state->g + (int)(pSearchStateSpace_->eps * state->h);
        key.key[1] = 1;
    }
    else {
        key.key[0] = state->v + state->h;
        key.key[1] = 0;
    }

    return key;
}